

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entry.c
# Opt level: O0

stumpless_element * locked_get_element_by_name(stumpless_entry *entry,char *name)

{
  stumpless_element *element_00;
  int iVar1;
  wchar_t cmp_result;
  stumpless_element *element;
  size_t i;
  char *name_local;
  stumpless_entry *entry_local;
  
  element = (stumpless_element *)0x0;
  while( true ) {
    if ((stumpless_element *)entry->element_count <= element) {
      raise_element_not_found();
      return (stumpless_element *)0x0;
    }
    element_00 = entry->elements[(long)element];
    lock_element(element_00);
    iVar1 = strcmp(element_00->name,name);
    unlock_element(element_00);
    if (iVar1 == 0) break;
    element = (stumpless_element *)(element->name + 1);
  }
  return element_00;
}

Assistant:

struct stumpless_element *
locked_get_element_by_name( const struct stumpless_entry *entry,
                            const char *name ) {
  size_t i;
  struct stumpless_element *element;
  int cmp_result;

  for( i = 0; i < entry->element_count; i++ ) {
    element = entry->elements[i];

    lock_element( element );
    cmp_result = strcmp( element->name, name );
    unlock_element( element );

    if( cmp_result == 0 ) {
      return element;
    }
  }

  raise_element_not_found(  );
  return NULL;
}